

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heuristic_binning_array_unaligned.h
# Opt level: O1

Split * __thiscall
embree::avx::UnalignedHeuristicArrayBinningSAH<embree::PrimRef,_32UL>::find_template<true>
          (Split *__return_storage_ptr__,
          UnalignedHeuristicArrayBinningSAH<embree::PrimRef,_32UL> *this,PrimInfoRange *set,
          size_t logBlockSize,LinearSpace3fa *space)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  float fVar3;
  undefined8 uVar4;
  int iVar5;
  unsigned_long uVar6;
  unsigned_long uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  char cVar15;
  unsigned_long __i0;
  long lVar16;
  ulong uVar17;
  undefined1 (*pauVar18) [16];
  runtime_error *this_00;
  undefined4 *puVar19;
  long lVar20;
  ulong uVar21;
  int iVar22;
  long lVar23;
  long lVar24;
  BinInfoT<32UL,_embree::PrimRef,_embree::BBox<embree::Vec3fa>_> *__return_storage_ptr___00;
  BinInfoT<32UL,_embree::PrimRef,_embree::BBox<embree::Vec3fa>_> *identity;
  float fVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [64];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  vuint4 vbestPos;
  BinMapping<32UL> mapping;
  BinBoundsAndCenter binBoundsAndCenter;
  task_group_context context;
  Binner binner;
  vfloat4 rAreas [32];
  anon_class_24_3_4f408fa6 local_1f80;
  blocked_range<unsigned_long> local_1f60 [3];
  anon_class_8_1_b5464bae local_1f10;
  PrimRef *local_1f08;
  undefined1 local_1f00 [32];
  undefined1 local_1ee0 [16];
  anon_class_16_2_ed117de8_conflict14 local_1ed0;
  BinBoundsAndCenter local_1ec0;
  task_group_context local_1e80 [3];
  undefined1 auStack_1c90 [16];
  undefined1 local_1c80 [3580];
  undefined4 uStack_e84;
  undefined1 local_e80 [20];
  float afStack_e6c [763];
  undefined1 local_280 [592];
  
  lVar16 = 0xc00;
  puVar19 = (undefined4 *)(local_1c80 + 0x50);
  do {
    puVar19[-4] = 0x7f800000;
    puVar19[-3] = 0x7f800000;
    puVar19[-2] = 0x7f800000;
    puVar19[-1] = 0x7f800000;
    *puVar19 = 0xff800000;
    puVar19[1] = 0xff800000;
    puVar19[2] = 0xff800000;
    puVar19[3] = 0xff800000;
    puVar19[-0xc] = 0x7f800000;
    puVar19[-0xb] = 0x7f800000;
    puVar19[-10] = 0x7f800000;
    puVar19[-9] = 0x7f800000;
    puVar19[-8] = 0xff800000;
    puVar19[-7] = 0xff800000;
    puVar19[-6] = 0xff800000;
    puVar19[-5] = 0xff800000;
    puVar19[-0x14] = 0x7f800000;
    puVar19[-0x13] = 0x7f800000;
    puVar19[-0x12] = 0x7f800000;
    puVar19[-0x11] = 0x7f800000;
    puVar19[-0x10] = 0xff800000;
    puVar19[-0xf] = 0xff800000;
    puVar19[-0xe] = 0xff800000;
    puVar19[-0xd] = 0xff800000;
    *(undefined8 *)(local_1c80 + lVar16) = 0;
    *(undefined8 *)(local_1c80 + lVar16 + 8) = 0;
    lVar16 = lVar16 + 0x10;
    puVar19 = puVar19 + 0x18;
  } while (lVar16 != 0xe00);
  uVar6 = (set->super_range<unsigned_long>)._begin;
  uVar7 = (set->super_range<unsigned_long>)._end;
  fVar25 = (float)(uVar7 - uVar6) * 0.05 + 4.0;
  uVar17 = (ulong)fVar25;
  uVar17 = (long)(fVar25 - 9.223372e+18) & (long)uVar17 >> 0x3f | uVar17;
  local_1f00._0_8_ = 0x20;
  if (uVar17 < 0x20) {
    local_1f00._0_8_ = uVar17;
  }
  local_1f10.mapping = (BinMapping<32UL> *)local_1f00;
  local_1f00._16_16_ = *(undefined1 (*) [16])&(set->super_CentGeomBBox3fa).centBounds.lower.field_0;
  auVar38 = vsubps_avx((undefined1  [16])(set->super_CentGeomBBox3fa).centBounds.upper.field_0,
                       local_1f00._16_16_);
  auVar28._8_4_ = 0x704ec3d;
  auVar28._0_8_ = 0x704ec3d0704ec3d;
  auVar28._12_4_ = 0x704ec3d;
  auVar36 = vmaxps_avx(auVar28,auVar38);
  auVar38 = vcmpps_avx(auVar36,auVar28,6);
  auVar28 = vshufps_avx(ZEXT416((uint)((float)(long)local_1f00._0_8_ * 0.99)),
                        ZEXT416((uint)((float)(long)local_1f00._0_8_ * 0.99)),0);
  auVar36 = vdivps_avx(auVar28,auVar36);
  local_1ee0 = vandps_avx(auVar38,auVar36);
  local_1ec0.scene = this->scene;
  local_1f80.binBoundsAndCenter = &local_1ec0;
  local_1ec0.space.vx.field_0._0_8_ = *(undefined8 *)&(space->vx).field_0;
  local_1ec0.space.vx.field_0._8_8_ = *(undefined8 *)((long)&(space->vx).field_0 + 8);
  local_1ec0.space.vy.field_0._0_8_ = *(undefined8 *)&(space->vy).field_0;
  local_1ec0.space.vy.field_0._8_8_ = *(undefined8 *)((long)&(space->vy).field_0 + 8);
  local_1ec0.space.vz.field_0._0_8_ = *(undefined8 *)&(space->vz).field_0;
  local_1ec0.space.vz.field_0._8_8_ = *(undefined8 *)((long)&(space->vz).field_0 + 8);
  local_1f08 = this->prims;
  local_1f80.mapping = local_1f10.mapping;
  local_1f80.prims = &local_1f08;
  local_1e80[0].my_version = proxy_support;
  local_1e80[0].my_traits = (context_traits)0x4;
  local_1e80[0].my_node.my_prev_node = (intrusive_list_node *)0x0;
  local_1e80[0].my_node.my_next_node = (intrusive_list_node *)0x0;
  local_1e80[0].my_name = CUSTOM_CTX;
  tbb::detail::r1::initialize(local_1e80);
  local_1f60[0].my_begin = uVar6;
  local_1f60[0].my_end = uVar7;
  local_1f60[0].my_grainsize = 0x1000;
  __return_storage_ptr___00 =
       (BinInfoT<32UL,_embree::PrimRef,_embree::BBox<embree::Vec3fa>_> *)local_e80;
  identity = (BinInfoT<32UL,_embree::PrimRef,_embree::BBox<embree::Vec3fa>_> *)local_1c80;
  local_1ed0.reduction = &local_1f10;
  local_1ed0.func = &local_1f80;
  tbb::detail::d1::
  parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,_embree::avx::BinInfoT<32UL,_embree::PrimRef,_embree::BBox<embree::Vec3fa>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_bvh____builders____builders_______common_algorithms_parallel_reduce_h:59:7),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_bvh____builders____builders_heuristic_binning_h:549:31)>
            (__return_storage_ptr___00,local_1f60,identity,&local_1ed0,&local_1f10,local_1e80);
  cVar15 = tbb::detail::r1::is_group_execution_cancelled(local_1e80);
  if (cVar15 == '\0') {
    tbb::detail::r1::destroy(local_1e80);
    lVar16 = 0;
    do {
      lVar20 = 0x10;
      do {
        puVar1 = (undefined8 *)((long)(__return_storage_ptr___00->_bounds + -1) + 0x50 + lVar20);
        uVar4 = puVar1[1];
        puVar2 = (undefined8 *)((long)(identity->_bounds + -1) + 0x50 + lVar20);
        *puVar2 = *puVar1;
        puVar2[1] = uVar4;
        puVar1 = (undefined8 *)
                 ((long)&__return_storage_ptr___00->_bounds[0][0].lower.field_0 + lVar20);
        uVar4 = puVar1[1];
        puVar2 = (undefined8 *)((long)&identity->_bounds[0][0].lower.field_0 + lVar20);
        *puVar2 = *puVar1;
        puVar2[1] = uVar4;
        lVar20 = lVar20 + 0x20;
      } while (lVar20 != 0x70);
      lVar16 = lVar16 + 1;
      __return_storage_ptr___00 =
           (BinInfoT<32UL,_embree::PrimRef,_embree::BBox<embree::Vec3fa>_> *)
           (__return_storage_ptr___00->_bounds + 1);
      identity = (BinInfoT<32UL,_embree::PrimRef,_embree::BBox<embree::Vec3fa>_> *)
                 (identity->_bounds + 1);
    } while (lVar16 != 0x20);
    memcpy(local_1c80 + 0xc00,local_280,0x200);
    lVar16 = local_1f00._0_8_ - 1;
    auVar36._8_4_ = 0x7f800000;
    auVar36._0_8_ = 0x7f8000007f800000;
    auVar36._12_4_ = 0x7f800000;
    auVar38._8_4_ = 0xff800000;
    auVar38._0_8_ = 0xff800000ff800000;
    auVar38._12_4_ = 0xff800000;
    if (lVar16 != 0) {
      lVar23 = local_1f00._0_8_ * 0x10;
      pauVar18 = (undefined1 (*) [16])(auStack_1c90 + local_1f00._0_8_ * 0x60);
      auVar27 = ZEXT1664((undefined1  [16])0x0);
      lVar24 = 0;
      lVar20 = lVar16;
      auVar37 = auVar38;
      auVar30 = auVar36;
      auVar31 = auVar36;
      auVar28 = auVar38;
      do {
        auVar9 = vpaddd_avx(auVar27._0_16_,
                            *(undefined1 (*) [16])(local_1c80 + lVar24 + lVar23 + 0xbf0));
        auVar27 = ZEXT1664(auVar9);
        auVar31 = vminps_avx(auVar31,pauVar18[-5]);
        auVar38 = vmaxps_avx(auVar38,pauVar18[-4]);
        *(undefined1 (*) [16])(local_1e80[0].padding + lVar24 + lVar23 + -0x58) = auVar9;
        auVar33 = vsubps_avx(auVar38,auVar31);
        auVar36 = vminps_avx(auVar36,pauVar18[-3]);
        auVar28 = vmaxps_avx(auVar28,pauVar18[-2]);
        auVar32 = vsubps_avx(auVar28,auVar36);
        auVar9 = vinsertps_avx(auVar32,auVar33,0x4c);
        auVar11 = vshufpd_avx(auVar33,auVar33,1);
        auVar11 = vinsertps_avx(auVar11,auVar32,0x9c);
        auVar33 = vunpcklps_avx(auVar33,auVar32);
        auVar32._0_4_ =
             (auVar11._0_4_ + auVar9._0_4_) * auVar33._0_4_ + auVar11._0_4_ * auVar9._0_4_;
        auVar32._4_4_ =
             (auVar11._4_4_ + auVar9._4_4_) * auVar33._4_4_ + auVar11._4_4_ * auVar9._4_4_;
        auVar32._8_4_ =
             (auVar11._8_4_ + auVar9._8_4_) * auVar33._8_4_ + auVar11._8_4_ * auVar9._8_4_;
        auVar32._12_4_ =
             (auVar11._12_4_ + auVar9._12_4_) * auVar33._12_4_ + auVar11._12_4_ * auVar9._12_4_;
        uVar4 = vmovlps_avx(auVar32);
        *(undefined8 *)(local_1c80 + lVar24 + lVar23 + 0xdf0) = uVar4;
        auVar30 = vminps_avx(auVar30,pauVar18[-1]);
        auVar37 = vmaxps_avx(auVar37,*pauVar18);
        auVar33 = vsubps_avx(auVar37,auVar30);
        auVar9 = vmovshdup_avx(auVar33);
        auVar11 = vshufpd_avx(auVar33,auVar33,1);
        *(float *)(local_1c80 + lVar24 + lVar23 + 0xdf8) =
             (auVar9._0_4_ + auVar11._0_4_) * auVar33._0_4_ + auVar9._0_4_ * auVar11._0_4_;
        *(undefined4 *)((long)&uStack_e84 + lVar24 + lVar23) = 0;
        lVar24 = lVar24 + -0x10;
        pauVar18 = pauVar18 + -6;
        lVar20 = lVar20 + -1;
      } while (lVar20 != 0);
    }
    uVar17 = 0xffffffff;
    auVar37._8_4_ = 0x7f800000;
    auVar37._0_8_ = 0x7f8000007f800000;
    auVar37._12_4_ = 0x7f800000;
    local_1f60[0].my_end = 0x7f8000007f800000;
    local_1f60[0].my_begin = auVar37._8_8_;
    auVar38 = (undefined1  [16])0x0;
    local_1f80.prims = (PrimRef **)0x0;
    local_1f80.mapping = (BinMapping<32UL> *)0x0;
    if (1 < (ulong)local_1f00._0_8_) {
      auVar32 = vpshufd_avx(ZEXT416((uint)~(-1 << ((byte)logBlockSize & 0x1f))),0);
      auVar27 = ZEXT1664((undefined1  [16])0x0);
      auVar29._8_8_ = 0x100000001;
      auVar29._0_8_ = 0x100000001;
      auVar30._8_4_ = 0x7f800000;
      auVar30._0_8_ = 0x7f8000007f800000;
      auVar30._12_4_ = 0x7f800000;
      auVar31._8_4_ = 0xff800000;
      auVar31._0_8_ = 0xff800000ff800000;
      auVar31._12_4_ = 0xff800000;
      auVar33 = ZEXT816(0) << 0x40;
      pauVar18 = (undefined1 (*) [16])(local_1c80 + 0x50);
      lVar20 = 0;
      auVar36 = auVar31;
      auVar9 = auVar30;
      auVar28 = auVar31;
      auVar11 = auVar30;
      auVar37 = auVar30;
      do {
        auVar30 = vminps_avx(auVar30,pauVar18[-5]);
        auVar31 = vmaxps_avx(auVar31,pauVar18[-4]);
        auVar9 = vminps_avx(auVar9,pauVar18[-3]);
        auVar36 = vmaxps_avx(auVar36,pauVar18[-2]);
        auVar13 = vsubps_avx(auVar31,auVar30);
        auVar14 = vsubps_avx(auVar36,auVar9);
        auVar11 = vminps_avx(auVar11,pauVar18[-1]);
        auVar28 = vmaxps_avx(auVar28,*pauVar18);
        auVar35 = vsubps_avx(auVar28,auVar11);
        auVar38 = vshufps_avx(auVar13,auVar35,0x65);
        auVar38 = vblendps_avx(auVar38,auVar14,2);
        auVar12 = vshufps_avx(auVar13,auVar35,0x96);
        auVar8 = vinsertps_avx(auVar12,auVar14,0x90);
        auVar12 = vshufps_avx(auVar13,auVar35,0);
        auVar33 = vpaddd_avx(auVar33,*(undefined1 (*) [16])(local_1c80 + lVar20 + 0xc00));
        auVar14 = vinsertps_avx(auVar12,auVar14,0x10);
        auVar12 = vpaddd_avx(auVar33,auVar32);
        auVar12 = vpsrld_avx(auVar12,ZEXT416((uint)logBlockSize));
        auVar13 = vpaddd_avx(auVar32,*(undefined1 (*) [16])(local_1e80[0].padding + lVar20 + -0x38))
        ;
        auVar35 = vpsrad_avx(auVar12,0x1f);
        auVar10._8_8_ = 0x4f0000004f000000;
        auVar10._0_8_ = 0x4f0000004f000000;
        auVar35 = vpand_avx(auVar35,auVar10);
        auVar26._8_4_ = 0x7fffffff;
        auVar26._0_8_ = 0x7fffffff7fffffff;
        auVar26._12_4_ = 0x7fffffff;
        auVar12 = vpand_avx(auVar12,auVar26);
        auVar12 = vcvtdq2ps_avx(auVar12);
        auVar13 = vpsrld_avx(auVar13,ZEXT416((uint)logBlockSize));
        auVar34 = vpsrad_avx(auVar13,0x1f);
        auVar10 = vpand_avx(auVar10,auVar34);
        auVar13 = vpand_avx(auVar13,auVar26);
        auVar13 = vcvtdq2ps_avx(auVar13);
        auVar34._0_4_ =
             (auVar14._0_4_ * (auVar38._0_4_ + auVar8._0_4_) + auVar38._0_4_ * auVar8._0_4_) *
             (auVar35._0_4_ + auVar12._0_4_) +
             (auVar13._0_4_ + auVar10._0_4_) * *(float *)(local_e80 + lVar20 + 0x10);
        auVar34._4_4_ =
             (auVar14._4_4_ * (auVar38._4_4_ + auVar8._4_4_) + auVar38._4_4_ * auVar8._4_4_) *
             (auVar35._4_4_ + auVar12._4_4_) +
             (auVar13._4_4_ + auVar10._4_4_) * *(float *)((long)afStack_e6c + lVar20);
        auVar34._8_4_ =
             (auVar14._8_4_ * (auVar38._8_4_ + auVar8._8_4_) + auVar38._8_4_ * auVar8._8_4_) *
             (auVar35._8_4_ + auVar12._8_4_) +
             (auVar13._8_4_ + auVar10._8_4_) * *(float *)((long)afStack_e6c + lVar20 + 4);
        auVar34._12_4_ =
             (auVar14._12_4_ * (auVar38._12_4_ + auVar8._12_4_) + auVar38._12_4_ * auVar8._12_4_) *
             (auVar35._12_4_ + auVar12._12_4_) +
             (auVar13._12_4_ + auVar10._12_4_) * *(float *)((long)afStack_e6c + lVar20 + 8);
        auVar38 = vcmpps_avx(auVar34,auVar37,1);
        auVar38 = vblendvps_avx(auVar27._0_16_,auVar29,auVar38);
        auVar27 = ZEXT1664(auVar38);
        auVar37 = vminps_avx(auVar34,auVar37);
        auVar29 = vpsubd_avx(auVar29,_DAT_01febe20);
        pauVar18 = pauVar18 + 6;
        lVar20 = lVar20 + 0x10;
        lVar16 = lVar16 + -1;
      } while (lVar16 != 0);
    }
    local_1f60[0].my_end = auVar37._0_8_;
    local_1f60[0].my_begin = auVar37._8_8_;
    local_1f80.prims = (PrimRef **)auVar38._0_8_;
    local_1f80.mapping = (BinMapping<32UL> *)auVar38._8_8_;
    fVar25 = INFINITY;
    uVar21 = 0;
    iVar22 = 0;
    do {
      if ((((*(float *)(local_1ee0 + uVar21 * 4) != 0.0) ||
           (NAN(*(float *)(local_1ee0 + uVar21 * 4)))) &&
          (fVar3 = *(float *)((long)&local_1f60[0].my_end + uVar21 * 4), fVar3 < fVar25)) &&
         (iVar5 = *(int *)((long)&local_1f80.prims + uVar21 * 4), iVar5 != 0)) {
        uVar17 = uVar21 & 0xffffffff;
        iVar22 = iVar5;
        fVar25 = fVar3;
      }
      uVar21 = uVar21 + 1;
    } while (uVar21 != 3);
    __return_storage_ptr__->sah = fVar25;
    __return_storage_ptr__->dim = (int)uVar17;
    (__return_storage_ptr__->field_2).pos = iVar22;
    __return_storage_ptr__->data = 0;
    (__return_storage_ptr__->mapping).num = local_1f00._0_8_;
    *(undefined8 *)&(__return_storage_ptr__->mapping).ofs.field_0 = local_1f00._16_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->mapping).ofs.field_0 + 8) = local_1f00._24_8_;
    *(undefined8 *)&(__return_storage_ptr__->mapping).scale.field_0 = local_1ee0._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->mapping).scale.field_0 + 8) = local_1ee0._8_8_;
    return __return_storage_ptr__;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"task cancelled");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

const Split find_template(const PrimInfoRange& set, const size_t logBlockSize, const LinearSpace3fa& space)
        {
          Binner binner(empty);
          const BinMapping<BINS> mapping(set);
          BinBoundsAndCenter binBoundsAndCenter(scene,space);
          bin_serial_or_parallel<parallel>(binner,prims,set.begin(),set.end(),size_t(4096),mapping,binBoundsAndCenter);
          return binner.best(mapping,logBlockSize);
        }